

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEndMacroCommand.h
# Opt level: O0

cmCommand * __thiscall cmEndMacroCommand::Clone(cmEndMacroCommand *this)

{
  cmCommand *this_00;
  cmEndMacroCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmEndMacroCommand((cmEndMacroCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmEndMacroCommand;
    }